

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

void cfd::core::AnalyzeBip32KeyData
               (void *extkey,string *base58,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *serialize_data,
               uint32_t *version,uint8_t *depth,uint32_t *child,ByteData256 *chaincode,
               Privkey *privkey,Pubkey *pubkey,uint32_t *fingerprint)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar1;
  char *pcVar2;
  uchar *puVar3;
  size_type sVar4;
  CfdException *pCVar5;
  ByteData local_340;
  Pubkey local_328;
  allocator<unsigned_char> local_309;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_308 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pubkey_bytes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e8;
  CfdSourceLocation local_2c8;
  ByteData256 local_2b0;
  Privkey local_298;
  allocator<unsigned_char> local_271;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_270 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> privkey_bytes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  CfdSourceLocation local_230;
  ByteData256 local_218;
  allocator<unsigned_char> local_1f9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1f8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> chaincode_bytes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  CfdSourceLocation local_1b8;
  undefined1 local_199;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  CfdSourceLocation local_178;
  size_t local_160;
  size_t written;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *serialize_bytes;
  allocator local_119;
  undefined1 local_118 [8];
  string clsname;
  ext_key output;
  uint32_t *child_local;
  uint8_t *depth_local;
  uint32_t *version_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *serialize_data_local;
  string *base58_local;
  void *extkey_local;
  
  output.pub_key_tweak_sum[8] = '\0';
  output.pub_key_tweak_sum[9] = '\0';
  output.pub_key_tweak_sum[10] = '\0';
  output.pub_key_tweak_sum[0xb] = '\0';
  output.pub_key_tweak_sum[0xc] = '\0';
  output.pub_key_tweak_sum[0xd] = '\0';
  output.pub_key_tweak_sum[0xe] = '\0';
  output.pub_key_tweak_sum[0xf] = '\0';
  output.pub_key_tweak_sum[0x10] = '\0';
  output.pub_key_tweak_sum[0x11] = '\0';
  output.pub_key_tweak_sum[0x12] = '\0';
  output.pub_key_tweak_sum[0x13] = '\0';
  output.pub_key_tweak_sum[0x14] = '\0';
  output.pub_key_tweak_sum[0x15] = '\0';
  output.pub_key_tweak_sum[0x16] = '\0';
  output.pub_key_tweak_sum[0x17] = '\0';
  output.pub_key[0x19] = '\0';
  output.pub_key[0x1a] = '\0';
  output.pub_key[0x1b] = '\0';
  output.pub_key[0x1c] = '\0';
  output.pub_key[0x1d] = '\0';
  output.pub_key[0x1e] = '\0';
  output.pub_key[0x1f] = '\0';
  output.pub_key[0x20] = '\0';
  output.pub_key_tweak_sum[0] = '\0';
  output.pub_key_tweak_sum[1] = '\0';
  output.pub_key_tweak_sum[2] = '\0';
  output.pub_key_tweak_sum[3] = '\0';
  output.pub_key_tweak_sum[4] = '\0';
  output.pub_key_tweak_sum[5] = '\0';
  output.pub_key_tweak_sum[6] = '\0';
  output.pub_key_tweak_sum[7] = '\0';
  output.pub_key[9] = '\0';
  output.pub_key[10] = '\0';
  output.pub_key[0xb] = '\0';
  output.pub_key[0xc] = '\0';
  output.pub_key[0xd] = '\0';
  output.pub_key[0xe] = '\0';
  output.pub_key[0xf] = '\0';
  output.pub_key[0x10] = '\0';
  output.pub_key[0x11] = '\0';
  output.pub_key[0x12] = '\0';
  output.pub_key[0x13] = '\0';
  output.pub_key[0x14] = '\0';
  output.pub_key[0x15] = '\0';
  output.pub_key[0x16] = '\0';
  output.pub_key[0x17] = '\0';
  output.pub_key[0x18] = '\0';
  output.version = 0;
  output.pad2[0] = '\0';
  output.pad2[1] = '\0';
  output.pad2[2] = '\0';
  output.pub_key[0] = '\0';
  output.pub_key[1] = '\0';
  output.pub_key[2] = '\0';
  output.pub_key[3] = '\0';
  output.pub_key[4] = '\0';
  output.pub_key[5] = '\0';
  output.pub_key[6] = '\0';
  output.pub_key[7] = '\0';
  output.pub_key[8] = '\0';
  output.hash160[4] = '\0';
  output.hash160[5] = '\0';
  output.hash160[6] = '\0';
  output.hash160[7] = '\0';
  output.hash160[8] = '\0';
  output.hash160[9] = '\0';
  output.hash160[10] = '\0';
  output.hash160[0xb] = '\0';
  output.hash160[0xc] = '\0';
  output.hash160[0xd] = '\0';
  output.hash160[0xe] = '\0';
  output.hash160[0xf] = '\0';
  output.hash160[0x10] = '\0';
  output.hash160[0x11] = '\0';
  output.hash160[0x12] = '\0';
  output.hash160[0x13] = '\0';
  output.priv_key[0x19] = '\0';
  output.priv_key[0x1a] = '\0';
  output.priv_key[0x1b] = '\0';
  output.priv_key[0x1c] = '\0';
  output.priv_key[0x1d] = '\0';
  output.priv_key[0x1e] = '\0';
  output.priv_key[0x1f] = '\0';
  output.priv_key[0x20] = '\0';
  output.child_num = 0;
  output.hash160[0] = '\0';
  output.hash160[1] = '\0';
  output.hash160[2] = '\0';
  output.hash160[3] = '\0';
  output.priv_key[9] = '\0';
  output.priv_key[10] = '\0';
  output.priv_key[0xb] = '\0';
  output.priv_key[0xc] = '\0';
  output.priv_key[0xd] = '\0';
  output.priv_key[0xe] = '\0';
  output.priv_key[0xf] = '\0';
  output.priv_key[0x10] = '\0';
  output.priv_key[0x11] = '\0';
  output.priv_key[0x12] = '\0';
  output.priv_key[0x13] = '\0';
  output.priv_key[0x14] = '\0';
  output.priv_key[0x15] = '\0';
  output.priv_key[0x16] = '\0';
  output.priv_key[0x17] = '\0';
  output.priv_key[0x18] = '\0';
  output.pad1[3] = '\0';
  output.pad1[4] = '\0';
  output.pad1[5] = '\0';
  output.pad1[6] = '\0';
  output.pad1[7] = '\0';
  output.pad1[8] = '\0';
  output.pad1[9] = '\0';
  output.priv_key[0] = '\0';
  output.priv_key[1] = '\0';
  output.priv_key[2] = '\0';
  output.priv_key[3] = '\0';
  output.priv_key[4] = '\0';
  output.priv_key[5] = '\0';
  output.priv_key[6] = '\0';
  output.priv_key[7] = '\0';
  output.priv_key[8] = '\0';
  output.parent160[8] = '\0';
  output.parent160[9] = '\0';
  output.parent160[10] = '\0';
  output.parent160[0xb] = '\0';
  output.parent160[0xc] = '\0';
  output.parent160[0xd] = '\0';
  output.parent160[0xe] = '\0';
  output.parent160[0xf] = '\0';
  output.parent160[0x10] = '\0';
  output.parent160[0x11] = '\0';
  output.parent160[0x12] = '\0';
  output.parent160[0x13] = '\0';
  output.depth = '\0';
  output.pad1[0] = '\0';
  output.pad1[1] = '\0';
  output.pad1[2] = '\0';
  output.chain_code[0x18] = '\0';
  output.chain_code[0x19] = '\0';
  output.chain_code[0x1a] = '\0';
  output.chain_code[0x1b] = '\0';
  output.chain_code[0x1c] = '\0';
  output.chain_code[0x1d] = '\0';
  output.chain_code[0x1e] = '\0';
  output.chain_code[0x1f] = '\0';
  output.parent160[0] = '\0';
  output.parent160[1] = '\0';
  output.parent160[2] = '\0';
  output.parent160[3] = '\0';
  output.parent160[4] = '\0';
  output.parent160[5] = '\0';
  output.parent160[6] = '\0';
  output.parent160[7] = '\0';
  output.chain_code[8] = '\0';
  output.chain_code[9] = '\0';
  output.chain_code[10] = '\0';
  output.chain_code[0xb] = '\0';
  output.chain_code[0xc] = '\0';
  output.chain_code[0xd] = '\0';
  output.chain_code[0xe] = '\0';
  output.chain_code[0xf] = '\0';
  output.chain_code[0x10] = '\0';
  output.chain_code[0x11] = '\0';
  output.chain_code[0x12] = '\0';
  output.chain_code[0x13] = '\0';
  output.chain_code[0x14] = '\0';
  output.chain_code[0x15] = '\0';
  output.chain_code[0x16] = '\0';
  output.chain_code[0x17] = '\0';
  clsname.field_2._8_8_ = 0;
  output.chain_code[0] = '\0';
  output.chain_code[1] = '\0';
  output.chain_code[2] = '\0';
  output.chain_code[3] = '\0';
  output.chain_code[4] = '\0';
  output.chain_code[5] = '\0';
  output.chain_code[6] = '\0';
  output.chain_code[7] = '\0';
  pcVar2 = "Constructor_ExtPubkey";
  if (privkey != (Privkey *)0x0) {
    pcVar2 = "Constructor_ExtPrivkey";
  }
  output.pub_key_tweak_sum._24_8_ = child;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)local_118,pcVar2 + 0xc,&local_119);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_119);
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ::std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&written + 7));
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret,0x52,
             (allocator<unsigned_char> *)((long)&written + 7));
  ::std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&written + 7));
  if (extkey == (void *)0x0) {
    pvVar1 = serialize_data;
    if (base58 != (string *)0x0) {
      local_160 = 0;
      pcVar2 = (char *)::std::__cxx11::string::c_str();
      puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
      sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
      written._0_4_ = wally_base58_to_bytes(pcVar2,1,puVar3,sVar4,&local_160);
      if ((int)written != 0) {
        local_178.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_hdwallet.cpp"
                     ,0x2f);
        local_178.filename = local_178.filename + 1;
        local_178.line = 0x45;
        local_178.funcname = "AnalyzeBip32KeyData";
        logger::warn<std::__cxx11::string&,int&>
                  (&local_178,"{} wally_base58_to_bytes error. ret={}",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                   (int *)&written);
        local_199 = 1;
        pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::operator+(&local_198,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_118," base58 decode error.");
        CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&local_198);
        local_199 = 0;
        __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
      }
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret,local_160);
      data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)&ret;
      pvVar1 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      if (serialize_data != (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
        ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)serialize_data,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
        pvVar1 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      }
    }
  }
  else {
    memcpy((void *)((long)&clsname.field_2 + 8),extkey,0xc0);
    pvVar1 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pvVar1;
  if (data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                        data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                       data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    written._0_4_ = bip32_key_unserialize(puVar3,sVar4,(ext_key *)((long)&clsname.field_2 + 8));
    if ((int)written != 0) {
      local_1b8.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_hdwallet.cpp"
                   ,0x2f);
      local_1b8.filename = local_1b8.filename + 1;
      local_1b8.line = 0x5a;
      local_1b8.funcname = "AnalyzeBip32KeyData";
      logger::warn<std::__cxx11::string&,int&>
                (&local_1b8,"{} bip32_key_unserialize error. ret={}",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118,
                 (int *)&written);
      chaincode_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::operator+(&local_1d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_118," unserialize error.");
      CfdException::CfdException(pCVar5,kCfdIllegalArgumentError,&local_1d8);
      chaincode_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
    }
    written._0_4_ = 0;
  }
  *version = output.hash160._12_4_;
  *depth = output.parent160[0xc];
  *(undefined4 *)output.pub_key_tweak_sum._24_8_ = output.priv_key._25_4_;
  if (fingerprint != (uint32_t *)0x0) {
    *fingerprint = output.chain_code._24_4_;
  }
  ::std::allocator<unsigned_char>::allocator(&local_1f9);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(local_1f8,0x20,&local_1f9);
  ::std::allocator<unsigned_char>::~allocator(&local_1f9);
  puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_1f8);
  sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_1f8);
  memcpy(puVar3,(void *)((long)&clsname.field_2 + 8),sVar4);
  ByteData256::ByteData256
            (&local_218,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1f8);
  ByteData256::operator=(chaincode,&local_218);
  ByteData256::~ByteData256(&local_218);
  if (privkey == (Privkey *)0x0) {
    if (pubkey != (Pubkey *)0x0) {
      if (output.pad1[2] == '\0') {
        local_2c8.filename =
             strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_hdwallet.cpp"
                     ,0x2f);
        local_2c8.filename = local_2c8.filename + 1;
        local_2c8.line = 0x76;
        local_2c8.funcname = "AnalyzeBip32KeyData";
        logger::warn<std::__cxx11::string&>
                  (&local_2c8,"{} privkey enabled.",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118);
        pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
        pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::operator+(&local_2e8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_118," keytype error.");
        CfdException::CfdException(pCVar5,kCfdIllegalStateError,&local_2e8);
        pubkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
        __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
      }
      ::std::allocator<unsigned_char>::allocator(&local_309);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                (local_308,0x21,&local_309);
      ::std::allocator<unsigned_char>::~allocator(&local_309);
      puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_308);
      sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_308);
      memcpy(puVar3,output.hash160 + 0x13,sVar4);
      ByteData::ByteData(&local_340,
                         (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_308);
      Pubkey::Pubkey(&local_328,&local_340);
      Pubkey::operator=(pubkey,&local_328);
      Pubkey::~Pubkey(&local_328);
      ByteData::~ByteData(&local_340);
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(local_308);
    }
  }
  else {
    if (output.pad1[2] != '\0') {
      local_230.filename =
           strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/cfdcore_hdwallet.cpp"
                   ,0x2f);
      local_230.filename = local_230.filename + 1;
      local_230.line = 0x6c;
      local_230.funcname = "AnalyzeBip32KeyData";
      logger::warn<std::__cxx11::string&>
                (&local_230,"{} privkey disabled.",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_118);
      privkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      pCVar5 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::operator+(&local_250,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_118," keytype error.");
      CfdException::CfdException(pCVar5,kCfdIllegalStateError,&local_250);
      privkey_bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
      __cxa_throw(pCVar5,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ::std::allocator<unsigned_char>::allocator(&local_271);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(local_270,0x20,&local_271);
    ::std::allocator<unsigned_char>::~allocator(&local_271);
    puVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(local_270);
    sVar4 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_270);
    memcpy(puVar3,output.pad1 + 3,sVar4);
    ByteData256::ByteData256
              (&local_2b0,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_270);
    Privkey::Privkey(&local_298,&local_2b0,kMainnet,true);
    Privkey::operator=(privkey,&local_298);
    Privkey::~Privkey(&local_298);
    ByteData256::~ByteData256(&local_2b0);
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(local_270);
  }
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(local_1f8);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
  ::std::__cxx11::string::~string((string *)local_118);
  return;
}

Assistant:

static void AnalyzeBip32KeyData(
    const void* extkey, const std::string* base58,
    std::vector<uint8_t>* serialize_data, uint32_t* version, uint8_t* depth,
    uint32_t* child, ByteData256* chaincode, Privkey* privkey, Pubkey* pubkey,
    uint32_t* fingerprint) {
  struct ext_key output = {};
  std::string clsname = (privkey != nullptr) ? "ExtPrivkey" : "ExtPubkey";
  const std::vector<uint8_t>* serialize_bytes = nullptr;
  std::vector<uint8_t> data(BIP32_SERIALIZED_LEN + BASE58_CHECKSUM_LEN);
  int ret;

  if (extkey != nullptr) {
    memcpy(&output, extkey, sizeof(output));
  } else if (base58 != nullptr) {
    size_t written = 0;
    ret = wally_base58_to_bytes(
        base58->c_str(), BASE58_FLAG_CHECKSUM, data.data(), data.size(),
        &written);
    if (ret != WALLY_OK) {
      warn(
          CFD_LOG_SOURCE, "{} wally_base58_to_bytes error. ret={}", clsname,
          ret);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          clsname + " base58 decode error.");
    }
    data.resize(written);
    serialize_bytes = &data;
    if (serialize_data != nullptr) {
      *serialize_data = data;
    }
  } else {
    serialize_bytes = serialize_data;
  }

  if (serialize_bytes != nullptr) {
    // unserialize
    ret = bip32_key_unserialize(
        serialize_bytes->data(), serialize_bytes->size(), &output);
    if (ret != WALLY_OK) {
      warn(
          CFD_LOG_SOURCE, "{} bip32_key_unserialize error. ret={}", clsname,
          ret);
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, clsname + " unserialize error.");
    }
  }

  *version = output.version;
  *depth = output.depth;
  *child = output.child_num;
  if (fingerprint) {
    memcpy(fingerprint, output.parent160, sizeof(*fingerprint));
  }
  std::vector<uint8_t> chaincode_bytes(kByteData256Length);
  memcpy(chaincode_bytes.data(), output.chain_code, chaincode_bytes.size());
  *chaincode = ByteData256(chaincode_bytes);
  if (privkey != nullptr) {
    if (output.priv_key[0] != BIP32_FLAG_KEY_PRIVATE) {
      warn(CFD_LOG_SOURCE, "{} privkey disabled.", clsname);
      throw CfdException(
          CfdError::kCfdIllegalStateError, clsname + " keytype error.");
    }
    // privkey
    std::vector<uint8_t> privkey_bytes(kByteData256Length);
    memcpy(privkey_bytes.data(), &output.priv_key[1], privkey_bytes.size());
    *privkey = Privkey(ByteData256(privkey_bytes));
  } else if (pubkey != nullptr) {
    if (output.priv_key[0] == BIP32_FLAG_KEY_PRIVATE) {
      warn(CFD_LOG_SOURCE, "{} privkey enabled.", clsname);
      throw CfdException(
          CfdError::kCfdIllegalStateError, clsname + " keytype error.");
    }
    std::vector<uint8_t> pubkey_bytes(Pubkey::kCompressedPubkeySize);
    memcpy(pubkey_bytes.data(), output.pub_key, pubkey_bytes.size());
    *pubkey = Pubkey(pubkey_bytes);
  }
}